

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

string * __thiscall
kratos::SystemVerilogCodeGen::enum_code_abi_cxx11_
          (string *__return_storage_ptr__,SystemVerilogCodeGen *this,Enum *enum_)

{
  undefined1 local_1b8 [8];
  Stream stream_;
  Enum *enum__local;
  
  stream_._408_8_ = this;
  Stream::Stream((Stream *)local_1b8,(Generator *)0x0,(SystemVerilogCodeGen *)0x0);
  enum_code_((Stream *)local_1b8,(Enum *)stream_._408_8_,false);
  std::__cxx11::stringstream::str();
  Stream::~Stream((Stream *)local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemVerilogCodeGen::enum_code(kratos::Enum* enum_) {
    Stream stream_(nullptr, nullptr);
    enum_code_(stream_, enum_, false);
    return stream_.str();
}